

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

DFrameBuffer * __thiscall
SDLVideo::CreateFrameBuffer(SDLVideo *this,int width,int height,bool fullscreen,DFrameBuffer *old)

{
  SDLFB *this_00;
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t len;
  byte local_81;
  SDLFB *local_58;
  SDLFB *fb;
  bool fsnow;
  SDLFB *fb_1;
  SDL_Window *oldwin;
  int flashAmount;
  PalEntry flashColor;
  DFrameBuffer *old_local;
  uint local_20;
  uint uStack_1c;
  bool fullscreen_local;
  int height_local;
  int width_local;
  SDLVideo *this_local;
  
  _flashAmount = (SDLFB *)old;
  local_20 = height;
  uStack_1c = width;
  _height_local = this;
  PalEntry::PalEntry((PalEntry *)((long)&oldwin + 4));
  this_00 = _flashAmount;
  fb_1 = (SDLFB *)0x0;
  if (_flashAmount == (SDLFB *)0x0) {
    len = 0;
    PalEntry::operator=((PalEntry *)((long)&oldwin + 4),0);
    oldwin._0_4_ = 0;
  }
  else {
    if (((_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width == uStack_1c) &&
       ((_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height == local_20)) {
      uVar1 = SDL_GetWindowFlags(_flashAmount->Screen);
      if (((uVar1 & 0x1001) != 0) != fullscreen) {
        SDLFB::SetFullscreen(this_00,fullscreen);
      }
      return &_flashAmount->super_DFrameBuffer;
    }
    fb_1 = (SDLFB *)_flashAmount->Screen;
    _flashAmount->Screen = (SDL_Window *)0x0;
    len = (long)&oldwin + 4;
    (*(_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
      _vptr_DObject[0x1f])(_flashAmount,len,&oldwin);
    (_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.ObjectFlags =
         (_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
         ObjectFlags | 0x80;
    if ((SDLFB *)screen == _flashAmount) {
      screen = (DFrameBuffer *)0x0;
    }
    if (_flashAmount != (SDLFB *)0x0) {
      (*(_flashAmount->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
        _vptr_DObject[2])();
    }
  }
  local_58 = (SDLFB *)DObject::operator_new((DObject *)0x7a0,len);
  SDLFB::SDLFB(local_58,uStack_1c,local_20,fullscreen,(SDL_Window *)fb_1);
  old_local._7_1_ = fullscreen;
  do {
    local_81 = 1;
    if (local_58 != (SDLFB *)0x0) {
      iVar2 = (*(local_58->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject.
                _vptr_DObject[7])();
      local_81 = (byte)iVar2 ^ 0xff;
    }
    if ((local_81 & 1) == 0) {
      CreateFrameBuffer::retry = 0;
      (*(local_58->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
        [0x1e])(local_58,(ulong)oldwin._4_4_,(ulong)(uint)oldwin);
      return &local_58->super_DFrameBuffer;
    }
    if ((local_58 != (SDLFB *)0x0) && (local_58 != (SDLFB *)0x0)) {
      (*(local_58->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
        [2])();
    }
    if (CreateFrameBuffer::retry == 0) {
      CreateFrameBuffer::owidth = uStack_1c;
      CreateFrameBuffer::oheight = local_20;
LAB_0034ed0e:
      I_ClosestResolution((int *)&stack0xffffffffffffffe4,(int *)&local_20,8);
    }
    else if (CreateFrameBuffer::retry == 1) {
      uStack_1c = CreateFrameBuffer::owidth;
      local_20 = CreateFrameBuffer::oheight;
      old_local._7_1_ = (old_local._7_1_ ^ 0xff) & 1;
    }
    else {
      if (CreateFrameBuffer::retry == 2) goto LAB_0034ed0e;
      I_FatalError("Could not create new screen (%d x %d)",(ulong)(uint)CreateFrameBuffer::owidth,
                   (ulong)(uint)CreateFrameBuffer::oheight);
    }
    CreateFrameBuffer::retry = CreateFrameBuffer::retry + 1;
    iVar2 = (*(this->super_IVideo)._vptr_IVideo[4])
                      (this,(ulong)uStack_1c,(ulong)local_20,(ulong)(old_local._7_1_ & 1),0);
    local_58 = (SDLFB *)CONCAT44(extraout_var,iVar2);
  } while( true );
}

Assistant:

DFrameBuffer *SDLVideo::CreateFrameBuffer (int width, int height, bool fullscreen, DFrameBuffer *old)
{
	static int retry = 0;
	static int owidth, oheight;
	
	PalEntry flashColor;
	int flashAmount;

	SDL_Window *oldwin = NULL;

	if (old != NULL)
	{ // Reuse the old framebuffer if its attributes are the same
		SDLFB *fb = static_cast<SDLFB *> (old);
		if (fb->Width == width &&
			fb->Height == height)
		{
			bool fsnow = (SDL_GetWindowFlags (fb->Screen) & SDL_WINDOW_FULLSCREEN_DESKTOP) != 0;
	
			if (fsnow != fullscreen)
			{
				fb->SetFullscreen (fullscreen);
			}
			return old;
		}

		oldwin = fb->Screen;
		fb->Screen = NULL;

		old->GetFlash (flashColor, flashAmount);
		old->ObjectFlags |= OF_YesReallyDelete;
		if (screen == old) screen = NULL;
		delete old;
	}
	else
	{
		flashColor = 0;
		flashAmount = 0;
	}
	
	SDLFB *fb = new SDLFB (width, height, fullscreen, oldwin);
	
	// If we could not create the framebuffer, try again with slightly
	// different parameters in this order:
	// 1. Try with the closest size
	// 2. Try in the opposite screen mode with the original size
	// 3. Try in the opposite screen mode with the closest size
	// This is a somewhat confusing mass of recursion here.

	while (fb == NULL || !fb->IsValid ())
	{
		if (fb != NULL)
		{
			delete fb;
		}

		switch (retry)
		{
		case 0:
			owidth = width;
			oheight = height;
		case 2:
			// Try a different resolution. Hopefully that will work.
			I_ClosestResolution (&width, &height, 8);
			break;

		case 1:
			// Try changing fullscreen mode. Maybe that will work.
			width = owidth;
			height = oheight;
			fullscreen = !fullscreen;
			break;

		default:
			// I give up!
			I_FatalError ("Could not create new screen (%d x %d)", owidth, oheight);
		}

		++retry;
		fb = static_cast<SDLFB *>(CreateFrameBuffer (width, height, fullscreen, NULL));
	}
	retry = 0;

	fb->SetFlash (flashColor, flashAmount);

	return fb;
}